

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O2

int add(char **argv)

{
  zip_t *pzVar1;
  FILE *pFVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  undefined8 uVar7;
  
  pzVar1 = za;
  pcVar5 = argv[1];
  sVar3 = strlen(pcVar5);
  lVar4 = zip_source_buffer(pzVar1,pcVar5,sVar3,0);
  pFVar2 = _stderr;
  pzVar1 = za;
  if (lVar4 == 0) {
    uVar7 = zip_strerror(za);
    fprintf(pFVar2,"can\'t create zip_source from buffer: %s\n",uVar7);
  }
  else {
    pcVar5 = decode_filename(*argv);
    lVar6 = zip_file_add(pzVar1,pcVar5,lVar4,0);
    if (lVar6 != -1) {
      return 0;
    }
    zip_source_free(lVar4);
    pFVar2 = _stderr;
    pcVar5 = *argv;
    uVar7 = zip_strerror(za);
    fprintf(pFVar2,"can\'t add file \'%s\': %s\n",pcVar5,uVar7);
  }
  return -1;
}

Assistant:

static int
add(char *argv[]) {
    zip_source_t *zs;

    if ((zs = zip_source_buffer(za, argv[1], strlen(argv[1]), 0)) == NULL) {
        fprintf(stderr, "can't create zip_source from buffer: %s\n", zip_strerror(za));
        return -1;
    }

    if (zip_file_add(za, decode_filename(argv[0]), zs, 0) == -1) {
        zip_source_free(zs);
        fprintf(stderr, "can't add file '%s': %s\n", argv[0], zip_strerror(za));
        return -1;
    }
    return 0;
}